

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_write(PgHdr *pPg)

{
  u8 *aData;
  Pager *pPager_00;
  i64 offset;
  int iVar1;
  u32 val;
  uint uVar2;
  uint uVar3;
  i64 iOff;
  char *pData2;
  u32 cksum;
  int rc;
  Pager *pPager;
  void *pData;
  PgHdr *pPg_local;
  
  aData = (u8 *)pPg->pData;
  pPager_00 = pPg->pPager;
  pData2._4_4_ = 0;
  if (pPager_00->errCode == 0) {
    if (pPager_00->readOnly == '\0') {
      if ((pPager_00->eState != '\x02') ||
         (pData2._4_4_ = pager_open_journal(pPager_00), pPg_local._4_4_ = pData2._4_4_,
         pData2._4_4_ == 0)) {
        sqlite3PcacheMakeDirty(pPg);
        iVar1 = pageInJournal(pPg);
        if ((iVar1 == 0) || (iVar1 = subjRequiresPage(pPg), iVar1 != 0)) {
          iVar1 = pageInJournal(pPg);
          if ((iVar1 == 0) && (iVar1 = pagerUseWal(pPager_00), iVar1 == 0)) {
            if ((pPager_00->dbOrigSize < pPg->pgno) ||
               (pPager_00->jfd->pMethods == (sqlite3_io_methods *)0x0)) {
              if (pPager_00->eState != '\x04') {
                pPg->flags = pPg->flags | 4;
              }
            }
            else {
              offset = pPager_00->journalOff;
              val = pager_cksum(pPager_00,aData);
              pPg->flags = pPg->flags | 4;
              iVar1 = write32bits(pPager_00->jfd,offset,pPg->pgno);
              if (iVar1 != 0) {
                return iVar1;
              }
              iVar1 = sqlite3OsWrite(pPager_00->jfd,aData,pPager_00->pageSize,offset + 4);
              if (iVar1 != 0) {
                return iVar1;
              }
              iVar1 = write32bits(pPager_00->jfd,offset + pPager_00->pageSize + 4,val);
              if (iVar1 != 0) {
                return iVar1;
              }
              pPager_00->journalOff = (long)(pPager_00->pageSize + 8) + pPager_00->journalOff;
              pPager_00->nRec = pPager_00->nRec + 1;
              uVar2 = sqlite3BitvecSet(pPager_00->pInJournal,pPg->pgno);
              uVar3 = addToSavepointBitvecs(pPager_00,pPg->pgno);
              pData2._4_4_ = uVar3 | uVar2;
              if (pData2._4_4_ != 0) {
                return pData2._4_4_;
              }
            }
          }
          iVar1 = subjRequiresPage(pPg);
          if (iVar1 != 0) {
            pData2._4_4_ = subjournalPage(pPg);
          }
        }
        if (pPager_00->dbSize < pPg->pgno) {
          pPager_00->dbSize = pPg->pgno;
        }
        pPg_local._4_4_ = pData2._4_4_;
      }
    }
    else {
      pPg_local._4_4_ = 3;
    }
  }
  else {
    pPg_local._4_4_ = pPager_00->errCode;
  }
  return pPg_local._4_4_;
}

Assistant:

static int pager_write(PgHdr *pPg){
  void *pData = pPg->pData;
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;

  /* This routine is not called unless a write-transaction has already 
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );

  /* If an error has been previously detected, report the same error
  ** again. This should not happen, but the check provides robustness. */
  if( NEVER(pPager->errCode) )  return pPager->errCode;

  /* Higher-level routines never call this function if database is not
  ** writable.  But check anyway, just for robustness. */
  if( NEVER(pPager->readOnly) ) return SQLITE_PERM;

  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page. 
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page as dirty.  If the page has already been written
  ** to the journal then we can return right away.
  */
  sqlite3PcacheMakeDirty(pPg);
  if( pageInJournal(pPg) && !subjRequiresPage(pPg) ){
    assert( !pagerUseWal(pPager) );
  }else{
  
    /* The transaction journal now exists and we have a RESERVED or an
    ** EXCLUSIVE lock on the main database file.  Write the current page to
    ** the transaction journal if it is not there already.
    */
    if( !pageInJournal(pPg) && !pagerUseWal(pPager) ){
      assert( pagerUseWal(pPager)==0 );
      if( pPg->pgno<=pPager->dbOrigSize && isOpen(pPager->jfd) ){
        u32 cksum;
        char *pData2;
        i64 iOff = pPager->journalOff;

        /* We should never write to the journal file the page that
        ** contains the database locks.  The following assert verifies
        ** that we do not. */
        assert( pPg->pgno!=PAGER_MJ_PGNO(pPager) );

        assert( pPager->journalHdr<=pPager->journalOff );
        CODEC2(pPager, pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
        cksum = pager_cksum(pPager, (u8*)pData2);

        /* Even if an IO or diskfull error occurs while journalling the
        ** page in the block above, set the need-sync flag for the page.
        ** Otherwise, when the transaction is rolled back, the logic in
        ** playback_one_page() will think that the page needs to be restored
        ** in the database file. And if an IO error occurs while doing so,
        ** then corruption may follow.
        */
        pPg->flags |= PGHDR_NEED_SYNC;

        rc = write32bits(pPager->jfd, iOff, pPg->pgno);
        if( rc!=SQLITE_OK ) return rc;
        rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
        if( rc!=SQLITE_OK ) return rc;
        rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
        if( rc!=SQLITE_OK ) return rc;

        IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno, 
                 pPager->journalOff, pPager->pageSize));
        PAGER_INCR(sqlite3_pager_writej_count);
        PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
             PAGERID(pPager), pPg->pgno, 
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

        pPager->journalOff += 8 + pPager->pageSize;
        pPager->nRec++;
        assert( pPager->pInJournal!=0 );
        rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
        testcase( rc==SQLITE_NOMEM );
        assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
        rc |= addToSavepointBitvecs(pPager, pPg->pgno);
        if( rc!=SQLITE_OK ){
          assert( rc==SQLITE_NOMEM );
          return rc;
        }
      }else{
        if( pPager->eState!=PAGER_WRITER_DBMOD ){
          pPg->flags |= PGHDR_NEED_SYNC;
        }
        PAGERTRACE(("APPEND %d page %d needSync=%d\n",
                PAGERID(pPager), pPg->pgno,
               ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
      }
    }
  
    /* If the statement journal is open and the page is not in it,
    ** then write the current page to the statement journal.  Note that
    ** the statement journal format differs from the standard journal format
    ** in that it omits the checksums and the header.
    */
    if( subjRequiresPage(pPg) ){
      rc = subjournalPage(pPg);
    }
  }

  /* Update the database size and return.
  */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}